

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void mp::PrintModelInfo(FlatModelInfo *fmi,char *header,bool aux_vars)

{
  _Rb_tree_node_base *fullString;
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  bool bVar31;
  int iVar32;
  int extraout_var;
  undefined4 extraout_var_00;
  int *piVar33;
  _Rb_tree_node_base *p_Var34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  _Base_ptr p_Var36;
  int extraout_EDX;
  undefined7 in_register_00000011;
  int iVar37;
  _Rb_tree_node_base *p_Var38;
  char *pcVar39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  int n_cones;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_alg;
  VarInfo vi;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  expr_logic;
  int nvb;
  int nvi;
  int nv;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  cones;
  int *in_stack_fffffffffffffe78;
  _Rb_tree_color local_17c;
  string local_178;
  char *local_158;
  int local_14c;
  _Rb_tree_color local_148;
  _Rb_tree_color local_144;
  int local_140;
  int local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong local_120;
  undefined8 local_118;
  int local_110 [2];
  undefined1 local_108 [32];
  _Rb_tree_node_base *local_e8;
  size_t local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_a8;
  char *local_78;
  int local_6c;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  
  iVar32 = (int)CONCAT71(in_register_00000011,aux_vars);
  local_78 = header;
  (*fmi->_vptr_FlatModelInfo[4])(&local_c0,fmi);
  local_68._0_4_ = iVar32;
  local_6c = iVar32;
  if (iVar32 != 0) {
    iVar32 = local_b4;
    local_68._0_4_ = local_b0;
    local_6c = local_ac;
  }
  local_68._4_4_ = iVar32 + local_c0;
  local_68._0_4_ = local_68._0_4_ + local_bc;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  local_6c = local_6c + local_b8;
  fmt::format<char_const*,int,int,int>
            ((string *)local_108,(fmt *)"{} has {} variables ({} integer, {} binary);\n",
             (CStringRef)&local_78,(char **)(local_68 + 4),(int *)args_1,&local_6c,
             in_stack_fffffffffffffe78);
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_a8;
  fmt::print((CStringRef)local_108._0_8_,(ArgList)(auVar2 << 0x40));
  pcVar39 = local_108 + 0x10;
  if ((char *)local_108._0_8_ != pcVar39) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  iVar32 = (*fmi->_vptr_FlatModelInfo[6])(fmi);
  local_118 = CONCAT44(extraout_var,iVar32);
  if (((iVar32 == 0) && (extraout_var == 0)) && (extraout_EDX == 0)) {
    pcVar39 = "No objectives;\n";
  }
  else {
    local_108._0_8_ = (char *)0x0;
    local_108._8_8_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_108;
    local_110[0] = extraout_EDX;
    fmt::print((CStringRef)0x3941f7,(ArgList)(auVar3 << 0x40));
    if ((int)local_118 != 0) {
      fmt::format<int>((string *)local_108,(CStringRef)0x394204,(int *)&local_118);
      local_a8._M_impl._0_8_ = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = &local_a8;
      fmt::print((CStringRef)local_108._0_8_,(ArgList)(auVar4 << 0x40));
      if ((char *)local_108._0_8_ != pcVar39) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
    }
    if (local_118._4_4_ != 0) {
      fmt::format<int>((string *)local_108,(CStringRef)0x394210,(int *)((long)&local_118 + 4));
      local_a8._M_impl._0_8_ = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = &local_a8;
      fmt::print((CStringRef)local_108._0_8_,(ArgList)(auVar5 << 0x40));
      if ((char *)local_108._0_8_ != pcVar39) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
    }
    if (local_110[0] != 0) {
      fmt::format<int>((string *)local_108,(CStringRef)0x39421f,local_110);
      local_a8._M_impl._0_8_ = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = &local_a8;
      fmt::print((CStringRef)local_108._0_8_,(ArgList)(auVar6 << 0x40));
      if ((char *)local_108._0_8_ != pcVar39) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
    }
    pcVar39 = "\n";
  }
  local_108._8_8_ = 0;
  local_108._0_8_ = (pointer)0x0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108;
  fmt::print((CStringRef)pcVar39,(ArgList)(auVar7 << 0x40));
  iVar32 = (*fmi->_vptr_FlatModelInfo[10])(fmi);
  local_13c = 0;
  local_108._24_8_ = local_108 + 8;
  local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
  local_108._16_8_ = 0;
  local_e0 = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_a8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &local_58;
  local_58._M_allocated_capacity._0_4_ = 0;
  local_58._8_8_ = 0;
  local_128 = 0;
  local_38 = 0;
  p_Var34 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar32) + 0x18);
  p_Var38 = (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar32) + 8);
  local_120 = 0;
  local_148 = _S_red;
  local_14c = 0;
  local_144 = _S_red;
  local_140 = 0;
  local_d8 = 0;
  local_d0 = 0;
  local_c8 = 0;
  local_e8 = (_Rb_tree_node_base *)local_108._24_8_;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = local_48;
  if (p_Var34 != p_Var38) {
    paVar35 = &local_178.field_2;
    local_c8 = 0;
    local_d0 = 0;
    local_d8 = 0;
    local_140 = 0;
    local_144 = _S_red;
    local_14c = 0;
    local_148 = _S_red;
    local_120 = 0;
    local_128 = 0;
    do {
      if (*(int *)((long)&p_Var34[2]._M_parent + 4) != 0) {
        local_178._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_lin","");
        fullString = p_Var34 + 1;
        bVar31 = begins_with((string *)fullString,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar35) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if (bVar31) {
          local_c8 = (ulong)(uint)((int)local_c8 + *(int *)((long)&p_Var34[2]._M_parent + 4));
        }
        else {
          local_178._M_dataplus._M_p = (pointer)paVar35;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_quad","");
          bVar31 = begins_with((string *)fullString,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != paVar35) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if (bVar31) {
            local_d0 = (ulong)(uint)((int)local_d0 + *(int *)((long)&p_Var34[2]._M_parent + 4));
          }
          else {
            local_178._M_dataplus._M_p = (pointer)paVar35;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"cone","");
            bVar31 = ends_with((string *)fullString,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar35) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar31) {
              iVar32 = *(int *)((long)&p_Var34[2]._M_parent + 4);
              local_13c = local_13c + iVar32;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_178,(char *)(*(long *)(p_Var34 + 2) + 1),
                         (allocator<char> *)&local_138);
              piVar33 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)(local_68 + 8),&local_178);
LAB_00352a60:
              *piVar33 = iVar32;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != paVar35) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_178._M_dataplus._M_p = (pointer)paVar35;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_condlin","");
              bVar31 = begins_with((string *)fullString,&local_178);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != paVar35) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              if (bVar31) {
                local_140 = local_140 + *(int *)((long)&p_Var34[2]._M_parent + 4);
              }
              else {
                local_178._M_dataplus._M_p = (pointer)paVar35;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_condquad","")
                ;
                bVar31 = begins_with((string *)fullString,&local_178);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != paVar35) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  local_178.field_2._M_allocated_capacity + 1);
                }
                if (bVar31) {
                  local_144 = local_144 + *(int *)((long)&p_Var34[2]._M_parent + 4);
                }
                else {
                  local_178._M_dataplus._M_p = (pointer)paVar35;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_nl","");
                  bVar31 = begins_with((string *)fullString,&local_178);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_dataplus._M_p != paVar35) {
                    operator_delete(local_178._M_dataplus._M_p,
                                    local_178.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar31) {
                    iVar32 = std::__cxx11::string::compare((char *)fullString);
                    if (iVar32 == 0) {
                      local_d8 = (ulong)(uint)((int)local_d8 +
                                              *(int *)((long)&p_Var34[2]._M_parent + 4));
                    }
                  }
                  else {
                    local_178._M_dataplus._M_p = (pointer)paVar35;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"_sos1","")
                    ;
                    bVar31 = begins_with((string *)fullString,&local_178);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != paVar35) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      local_178.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar31) {
                      local_120 = (ulong)(uint)((int)local_120 +
                                               *(int *)((long)&p_Var34[2]._M_parent + 4));
                    }
                    else {
                      local_178._M_dataplus._M_p = (pointer)paVar35;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_178,"_sos2","");
                      bVar31 = begins_with((string *)fullString,&local_178);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_178._M_dataplus._M_p != paVar35) {
                        operator_delete(local_178._M_dataplus._M_p,
                                        local_178.field_2._M_allocated_capacity + 1);
                      }
                      if (bVar31) {
                        local_148 = local_148 + *(int *)((long)&p_Var34[2]._M_parent + 4);
                      }
                      else {
                        local_178._M_dataplus._M_p = (pointer)paVar35;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_178,"_indlin","");
                        bVar31 = begins_with((string *)fullString,&local_178);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_178._M_dataplus._M_p != paVar35) {
                          operator_delete(local_178._M_dataplus._M_p,
                                          local_178.field_2._M_allocated_capacity + 1);
                        }
                        if (bVar31) {
                          local_14c = local_14c + *(int *)((long)&p_Var34[2]._M_parent + 4);
                        }
                        else {
                          local_178._M_dataplus._M_p = (pointer)paVar35;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_178,"_indquad","");
                          bVar31 = begins_with((string *)fullString,&local_178);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_178._M_dataplus._M_p != paVar35) {
                            operator_delete(local_178._M_dataplus._M_p,
                                            local_178.field_2._M_allocated_capacity + 1);
                          }
                          if (bVar31) {
                            local_128 = (ulong)(uint)((int)local_128 +
                                                     *(int *)((long)&p_Var34[2]._M_parent + 4));
                          }
                          else {
                            local_178._M_dataplus._M_p = (pointer)paVar35;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_178,"_uenc","");
                            bVar31 = begins_with((string *)fullString,&local_178);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_178._M_dataplus._M_p != paVar35) {
                              operator_delete(local_178._M_dataplus._M_p,
                                              local_178.field_2._M_allocated_capacity + 1);
                            }
                            if (!bVar31) {
                              iVar32 = *(int *)((long)&p_Var34[2]._M_parent + 4);
                              if (*(char *)&p_Var34[2]._M_parent == '\x01') {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_178,(char *)(*(long *)(p_Var34 + 2) + 1)
                                           ,(allocator<char> *)&local_138);
                                piVar33 = std::
                                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)&local_a8,&local_178);
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_178,(char *)(*(long *)(p_Var34 + 2) + 1)
                                           ,(allocator<char> *)&local_138);
                                piVar33 = std::
                                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_108,&local_178);
                              }
                              goto LAB_00352a60;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var34);
    } while (p_Var34 != p_Var38);
  }
  iVar37 = (int)local_d8;
  iVar32 = (int)local_d0;
  iVar1 = (int)local_c8;
  if (iVar32 + iVar1 + (int)local_120 + iVar37 + local_13c + local_148 != 0) {
    local_178._M_dataplus._M_p = (char *)0x0;
    local_178._M_string_length = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = &local_178;
    fmt::print((CStringRef)0x39426b,(ArgList)(auVar8 << 0x40));
    local_158 = "linear";
    if (iVar1 != 0) {
      local_17c = iVar1;
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar9 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "quadratic";
    if (iVar32 != 0) {
      local_17c = iVar32;
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar10 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "nonlinear";
    local_17c = iVar37;
    if (iVar37 != 0) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar11 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_13c != 0) {
      fmt::format<int>(&local_178,(CStringRef)0x394283,&local_13c);
      local_138 = 0;
      uStack_130 = 0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar12 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_48 != &local_58) {
        iVar32 = 1;
        paVar35 = local_48;
        do {
          if (iVar32 != 1) {
            local_178._M_dataplus._M_p = (char *)0x0;
            local_178._M_string_length = 0;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = &local_178;
            fmt::print((CStringRef)0x38fc57,(ArgList)(auVar13 << 0x40));
          }
          fmt::format<int,std::__cxx11::string>
                    (&local_178,(fmt *)"{} {}",(CStringRef)(paVar35 + 4),
                     (int *)paVar35[2]._M_local_buf,args_1);
          local_138 = 0;
          uStack_130 = 0;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = &local_138;
          fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar14 << 0x40));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if (iVar32 != (int)local_38) {
            local_178._M_dataplus._M_p = (char *)0x0;
            local_178._M_string_length = 0;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = &local_178;
            fmt::print((CStringRef)0x390c54,(ArgList)(auVar15 << 0x40));
          }
          paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar35);
          iVar32 = iVar32 + 1;
        } while (paVar35 != &local_58);
      }
      local_178._M_dataplus._M_p = (char *)0x0;
      local_178._M_string_length = 0;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = &local_178;
      fmt::print((CStringRef)0x394295,(ArgList)(auVar16 << 0x40));
    }
    local_158 = "SOS1";
    local_17c = (_Rb_tree_color)local_120;
    if (local_17c != 0) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar17 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "SOS2";
    local_17c = local_148;
    if (local_148 != _S_red) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar18 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_178._M_dataplus._M_p = (pointer)0x0;
    local_178._M_string_length = 0;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = &local_178;
    fmt::print((CStringRef)0x38f4f3,(ArgList)(auVar19 << 0x40));
  }
  if (local_e0 != 0) {
    local_178._M_dataplus._M_p = (char *)0x0;
    local_178._M_string_length = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = &local_178;
    fmt::print((CStringRef)0x3942a2,(ArgList)(auVar20 << 0x40));
    if ((_Rb_tree_node_base *)local_108._24_8_ != (_Rb_tree_node_base *)(local_108 + 8)) {
      p_Var34 = (_Rb_tree_node_base *)local_108._24_8_;
      do {
        local_158 = *(char **)(p_Var34 + 1);
        local_17c = p_Var34[2]._M_color;
        if (local_17c != _S_red) {
          fmt::format<int,char_const*>
                    (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                     (char **)args_1);
          local_138 = 0;
          uStack_130 = 0;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = &local_138;
          fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar21 << 0x40));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var34 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var34);
      } while (p_Var34 != (_Rb_tree_node_base *)(local_108 + 8));
    }
    local_178._M_dataplus._M_p = (pointer)0x0;
    local_178._M_string_length = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = &local_178;
    fmt::print((CStringRef)0x38f4f3,(ArgList)(auVar22 << 0x40));
  }
  if (((local_a8._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_140 != 0)) ||
     ((local_144 != _S_red || ((local_14c != 0 || ((int)local_128 != 0)))))) {
    local_178._M_dataplus._M_p = (char *)0x0;
    local_178._M_string_length = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = &local_178;
    fmt::print((CStringRef)0x3942ba,(ArgList)(auVar23 << 0x40));
    local_158 = "indicator(s)";
    local_17c = local_14c;
    if (local_14c != 0) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar24 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "quadratic indicator(s)";
    local_17c = (_Rb_tree_color)local_128;
    if (local_17c != 0) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar25 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "conditional (in)equalitie(s)";
    local_17c = local_140;
    if (local_140 != 0) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar26 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_158 = "conditional quadratic (in)equalitie(s)";
    local_17c = local_144;
    if (local_144 != _S_red) {
      fmt::format<int,char_const*>
                (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                 (char **)args_1);
      local_138 = 0;
      uStack_130 = 0;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = &local_138;
      fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar27 << 0x40));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_a8._M_impl.super__Rb_tree_header) {
      p_Var36 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_158 = *(char **)(p_Var36 + 1);
        local_17c = p_Var36[2]._M_color;
        if (local_17c != _S_red) {
          fmt::format<int,char_const*>
                    (&local_178,(fmt *)" {} {};",(CStringRef)&local_17c,(int *)&local_158,
                     (char **)args_1);
          local_138 = 0;
          uStack_130 = 0;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = &local_138;
          fmt::print((CStringRef)local_178._M_dataplus._M_p,(ArgList)(auVar28 << 0x40));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var36 = (_Base_ptr)std::_Rb_tree_increment(p_Var36);
      } while ((_Rb_tree_header *)p_Var36 != &local_a8._M_impl.super__Rb_tree_header);
    }
    local_178._M_dataplus._M_p = (pointer)0x0;
    local_178._M_string_length = 0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = &local_178;
    fmt::print((CStringRef)0x38f4f3,(ArgList)(auVar29 << 0x40));
  }
  local_178._M_dataplus._M_p = (pointer)0x0;
  local_178._M_string_length = 0;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = &local_178;
  fmt::print((CStringRef)0x38f4f3,(ArgList)(auVar30 << 0x40));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)(local_68 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_108);
  return;
}

Assistant:

void PrintModelInfo(const FlatModelInfo& fmi,
    const char* header, bool aux_vars) {
  auto vi = fmi.GetVarInfo();
  int nv = vi[0] + aux_vars*vi[3];
  int nvi = vi[1] + aux_vars*vi[4];
  int nvb = vi[2] + aux_vars*vi[5];
  fmt::print(fmt::format(
      "{} has {} variables ({} integer, {} binary);\n",
      header, nv, nvi, nvb));
  auto oi = fmi.GetObjInfo();
  if (true || 1!=oi[0] || oi[1] || oi[2]) {
    if (!oi[0] && !oi[1] && !oi[2])
      fmt::print("No objectives;\n");
    else {
      fmt::print("Objectives: ");
      if (oi[0])
        fmt::print(fmt::format("{} linear; ", oi[0]));
      if (oi[1])
        fmt::print(fmt::format("{} quadratic; ", oi[1]));
      if (oi[2])
        fmt::print(fmt::format("{} nonlinear; ", oi[2]));
      fmt::print("\n");
    }
  }
  const auto& coninfo = fmi.GetConstraintTypes();
  int n_lin = 0;
  int n_quad = 0;
  int n_nl = 0;
  int n_cones = 0;
  int n_condlin = 0, n_condquad = 0;
  int n_indlin = 0, n_indquad = 0;
  int n_sos1 = 0, n_sos2 = 0;
  std::map<std::string, int> expr_alg, expr_logic, cones;
  auto NewName = [](const char* old) { return old+1; };  // skip _
  for (const auto& val: coninfo) {
    if (val.second.n_) {
      if (begins_with(val.first, "_lin"))
        n_lin += val.second.n_;
      else if (begins_with(val.first, "_quad"))
        n_quad += val.second.n_;
      else if (ends_with(val.first, "cone")) {
        n_cones += val.second.n_;
        cones[NewName(val.second.name_)] = val.second.n_;
      }
      else if (begins_with(val.first, "_condlin"))
        n_condlin += val.second.n_;
      else if (begins_with(val.first, "_condquad"))
        n_condquad += val.second.n_;
      else if (begins_with(val.first, "_nl")) {
        if (val.first == "_nlcon")
          n_nl += val.second.n_;
      }  // else, NL assignment or logical - skip
      else if (begins_with(val.first, "_sos1"))
        n_sos1 += val.second.n_;
      else if (begins_with(val.first, "_sos2"))
        n_sos2 += val.second.n_;
      else if (begins_with(val.first, "_indlin"))
        n_indlin += val.second.n_;
      else if (begins_with(val.first, "_indquad"))
        n_indquad += val.second.n_;
      else if (begins_with(val.first, "_uenc"))
      { }
      // Else, it's expressions
      else if (val.second.is_logical_)
        expr_logic[NewName(val.second.name_)] = val.second.n_;
      else
        expr_alg[NewName(val.second.name_)] = val.second.n_;
    }
  }
  auto PrnType = [](const char* descr, int n) {
    if (n)
      fmt::print(fmt::format(" {} {};", n, descr));
  };
  if (n_lin + n_quad + n_nl + n_cones + n_sos1 + n_sos2) {
    fmt::print("Constraints: ");
    PrnType("linear", n_lin);
    PrnType("quadratic", n_quad);
    PrnType("nonlinear", n_nl);
    if (n_cones) {
      fmt::print(fmt::format(" {} conic (", n_cones));
      int i=0;
      for (const auto& cone: cones) {
        if (i++)
          fmt::print(" ");
        fmt::print(fmt::format("{} {}", cone.second, cone.first));
        if (int(cones.size())!=i)
          fmt::print(",");
      }
      fmt::print(");");
    }
    PrnType("SOS1", n_sos1);
    PrnType("SOS2", n_sos2);
    fmt::print("\n");
  }
  if (expr_alg.size()) {
    fmt::print("Algebraic expressions: ");
    for (const auto& expr: expr_alg)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  if (expr_logic.size()
      || n_condlin || n_condquad
      || n_indlin || n_indquad) {
    fmt::print("Logical expressions: ");
    PrnType("indicator(s)", n_indlin);
    PrnType("quadratic indicator(s)", n_indquad);
    PrnType("conditional (in)equalitie(s)", n_condlin);
    PrnType("conditional quadratic (in)equalitie(s)", n_condquad);
    for (const auto& expr: expr_logic)
      PrnType(expr.first.c_str(), expr.second);
    fmt::print("\n");
  }
  fmt::print("\n");
}